

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::logBuild
          (CLIntercept *this,time_point buildTimeStart,cl_program program,cl_uint numDevices,
          cl_device_id *deviceList)

{
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  int iVar4;
  cl_int cVar5;
  long lVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  char *pcVar9;
  undefined8 uVar10;
  ulong uVar11;
  bool bVar12;
  float __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  cl_build_status buildStatus;
  size_t buildLogSize;
  cl_device_id *localDeviceList;
  char numberString [256];
  cl_uint local_1c4;
  cl_program local_1c0;
  cl_build_status local_1b4;
  char *local_1b0;
  char *local_1a8;
  cl_int local_19c;
  cl_device_id *local_198;
  pthread_mutex_t *local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  cl_device_id *local_168;
  CEnumNameMap *local_160;
  string local_158;
  undefined1 *local_138 [2];
  undefined1 local_128 [248];
  
  local_1c4 = numDevices;
  local_1c0 = program;
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_190 = (pthread_mutex_t *)&this->m_Mutex;
  iVar4 = pthread_mutex_lock(local_190);
  if (iVar4 != 0) {
    uVar10 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock(local_190);
    _Unwind_Resume(uVar10);
  }
  local_168 = (cl_device_id *)0x0;
  if (deviceList == (cl_device_id *)0x0) {
    cVar5 = allocateAndGetProgramDeviceList(this,program,&local_1c4,&local_168);
    deviceList = (cl_device_id *)0x0;
    bVar12 = cVar5 == 0;
    if (bVar12) {
      deviceList = local_168;
    }
  }
  else {
    bVar12 = true;
  }
  local_198 = local_168;
  if ((bVar12) && ((this->m_Config).BuildLogging != false)) {
    pmVar7 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&local_1c0);
    memset(local_138,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar1 = pmVar7->CompileCount;
      uVar2 = (uint)pmVar7->ProgramHash;
      pcVar9 = "$%08X_%04u_%08X";
    }
    else {
      uVar1 = (uint)pmVar7->ProgramHash;
      uVar2 = pmVar7->ProgramNumber;
      pcVar9 = "$%04u_%08X_%04u_%08X";
    }
    snprintf((char *)local_138,0x100,pcVar9 + 1,(ulong)uVar2,(ulong)uVar1);
    logf(this,__x);
    logf(this,SUB84((double)((float)(lVar6 - (long)buildTimeStart.__d.__r) / 1e+06),0));
  }
  if ((bool)(bVar12 & local_1c4 != 0)) {
    local_160 = &this->m_EnumNameMap;
    uVar11 = 0;
    do {
      if ((this->m_Config).BuildLogging == true) {
        local_1b4 = -1;
        cVar5 = (*(this->m_Dispatch).clGetProgramBuildInfo)
                          (local_1c0,deviceList[uVar11],0x1181,4,&local_1b4,(size_t *)0x0);
        if (cVar5 == 0) {
          local_1a8 = (char *)0x0;
          local_1b0 = (char *)0x0;
          local_19c = allocateAndGetDeviceInfoString(this,deviceList[uVar11],0x102b,&local_1a8);
          cVar5 = allocateAndGetDeviceInfoString(this,deviceList[uVar11],0x103d,&local_1b0);
          memset(local_138,0,0x100);
          snprintf((char *)local_138,0x100,"Build Status for device %u = ");
          local_188[0] = local_178;
          sVar8 = strlen((char *)local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_188,local_138,(long)local_138 + sVar8);
          if (cVar5 == 0 && local_19c == 0) {
            std::__cxx11::string::append((char *)local_188);
            std::__cxx11::string::append((char *)local_188);
            std::__cxx11::string::append((char *)local_188);
            std::__cxx11::string::append((char *)local_188);
          }
          CEnumNameMap::name_build_status_abi_cxx11_(&local_158,local_160,local_1b4);
          std::__cxx11::string::_M_append((char *)local_188,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          __x_00 = (double)std::__cxx11::string::append((char *)local_188);
          log(this,__x_00);
          if (local_1a8 != (char *)0x0) {
            operator_delete__(local_1a8);
          }
          if (local_1b0 != (char *)0x0) {
            operator_delete__(local_1b0);
          }
          if (local_188[0] != local_178) {
            operator_delete(local_188[0]);
          }
        }
      }
      local_188[0] = (undefined1 *)0x0;
      cVar5 = (*(this->m_Dispatch).clGetProgramBuildInfo)
                        (local_1c0,deviceList[uVar11],0x1183,0,(void *)0x0,(size_t *)local_188);
      puVar3 = local_188[0];
      if (cVar5 == 0) {
        pcVar9 = (char *)operator_new__((long)local_188[0] + 1);
        (*(this->m_Dispatch).clGetProgramBuildInfo)
                  (local_1c0,deviceList[uVar11],0x1183,(size_t)puVar3,pcVar9,(size_t *)0x0);
        if (pcVar9[(long)local_188[0] - 1] == '\0') {
          local_188[0] = (undefined1 *)((long)local_188[0] - 1);
        }
        else {
          pcVar9[(long)local_188[0]] = '\0';
        }
        if ((this->m_Config).BuildLogging == true) {
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"-------> Start of Build Log:\n","");
          log(this,__x_01);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0]);
          }
          local_138[0] = local_128;
          sVar8 = strlen(pcVar9);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_138,pcVar9,pcVar9 + sVar8)
          ;
          log(this,__x_02);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0]);
          }
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"<------- End of Build Log\n\n","");
          log(this,__x_03);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0]);
          }
        }
        if ((this->m_Config).DumpProgramBuildLogs == true) {
          dumpProgramBuildLog(this,local_1c0,deviceList[uVar11],pcVar9,(size_t)local_188[0]);
        }
        operator_delete__(pcVar9);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < local_1c4);
  }
  if (local_198 != (cl_device_id *)0x0) {
    operator_delete__(local_198);
  }
  pthread_mutex_unlock(local_190);
  return;
}

Assistant:

void CLIntercept::logBuild(
    clock::time_point buildTimeStart,
    const cl_program program,
    cl_uint numDevices,
    const cl_device_id* deviceList )
{
    std::chrono::duration<float, std::milli>    buildDuration =
        clock::now() - buildTimeStart;

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id*   localDeviceList = NULL;

    cl_int  errorCode = CL_SUCCESS;

    // There are two possibilities.  Either the device_list is NULL, in which
    // case we need to get the build log for all devices, or it's non-NULL,
    // in which case we only need to get the build log for all devices in
    // the device list.

    if( ( errorCode == CL_SUCCESS ) &&
        ( deviceList == NULL ) )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            localDeviceList );
        if( errorCode == CL_SUCCESS )
        {
            deviceList = localDeviceList;
        }
    }

    if( m_Config.BuildLogging &&
        errorCode == CL_SUCCESS )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        char    numberString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        logf( "Build Info for program %p (%s) for %u device(s):\n",
            program,
            numberString,
            numDevices );

        float   buildTimeMS = buildDuration.count();
        logf( "    Build finished in %.2f ms.\n", buildTimeMS );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint i = 0; i < numDevices; i++ )
        {
            if( m_Config.BuildLogging )
            {
                cl_build_status buildStatus = CL_BUILD_NONE;
                errorCode = dispatch().clGetProgramBuildInfo(
                    program,
                    deviceList[ i ],
                    CL_PROGRAM_BUILD_STATUS,
                    sizeof( buildStatus ),
                    &buildStatus,
                    NULL );

                if( errorCode == CL_SUCCESS )
                {
                    char*   deviceName = NULL;
                    char*   deviceOpenCLCVersion = NULL;
                    errorCode = allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_NAME,
                        deviceName );
                    errorCode |= allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_OPENCL_C_VERSION,
                        deviceOpenCLCVersion );

                    char    str[256] = "";

                    CLI_SPRINTF( str, 256, "Build Status for device %u = ", i );

                    std::string message = str;

                    if( errorCode == CL_SUCCESS )
                    {
                        message += deviceName;
                        message += " (";
                        message += deviceOpenCLCVersion;
                        message += "): ";
                    }

                    message += enumName().name_build_status( buildStatus );
                    message += "\n";

                    log( message );

                    delete [] deviceName;
                    deviceName = NULL;

                    delete [] deviceOpenCLCVersion;
                    deviceOpenCLCVersion = NULL;
                }
            }

            size_t  buildLogSize = 0;
            errorCode = dispatch().clGetProgramBuildInfo(
                program,
                deviceList[ i ],
                CL_PROGRAM_BUILD_LOG,
                0,
                NULL,
                &buildLogSize );

            if( errorCode == CL_SUCCESS )
            {
                char*   buildLog = new char[ buildLogSize + 1 ];
                if( buildLog )
                {
                    dispatch().clGetProgramBuildInfo(
                        program,
                        deviceList[ i ],
                        CL_PROGRAM_BUILD_LOG,
                        buildLogSize,
                        buildLog,
                        NULL );

                    // Check if the build log is already null-terminated.
                    // If it is, we're good, otherwise null terminate it.
                    if( buildLog[ buildLogSize - 1 ] == '\0' )
                    {
                        buildLogSize--;
                    }
                    else
                    {
                        buildLog[ buildLogSize ] = '\0';
                    }

                    if( m_Config.BuildLogging )
                    {
                        log( "-------> Start of Build Log:\n" );
                        log( std::string(buildLog) );
                        log( "<------- End of Build Log\n\n" );
                    }
                    if( m_Config.DumpProgramBuildLogs )
                    {
                        dumpProgramBuildLog(
                            program,
                            deviceList[ i ],
                            buildLog,
                            buildLogSize );
                    }

                    delete [] buildLog;
                }
            }
        }
    }

    delete [] localDeviceList;
}